

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdObjFindOrAdd(If_DsdMan_t *p,int Type,int *pLits,int nLits,word *pTruth)

{
  byte *pbVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint *puVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  uint *puVar12;
  If_DsdObj_t *pObj;
  long lVar13;
  size_t __size;
  
  if (Type == 6) {
    iVar5 = p->vTtMem[nLits]->nEntries;
    iVar4 = Vec_MemHashInsert(p->vTtMem[nLits],pTruth);
  }
  else {
    iVar4 = -1;
    iVar5 = iVar4;
  }
  puVar9 = If_DsdObjHashLookup(p,Type,pLits,nLits,iVar4);
  uVar8 = *puVar9;
  if (uVar8 == 0) {
    if (((-1 < iVar4) && (p->LutSize != 0)) && (iVar4 == p->vTtDecs[nLits]->nSize)) {
      pVVar10 = Dau_DecFindSets_int(pTruth,nLits,p->pSched);
      if (iVar4 != p->vTtMem[nLits]->nEntries + -1) {
        __assert_fail("truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                      ,0x3ed,"int If_DsdObjFindOrAdd(If_DsdMan_t *, int, int *, int, word *)");
      }
      Vec_PtrPush(p->vTtDecs[nLits],pVVar10);
    }
    if ((p->vIsops[nLits] != (Vec_Wec_t *)0x0 && -1 < iVar4) &&
       (iVar5 != p->vTtMem[nLits]->nEntries)) {
      pVVar10 = Vec_WecPushLevel(p->vIsops[nLits]);
      iVar5 = Kit_TruthIsop((uint *)pTruth,nLits,p->vCover,1);
      if ((-1 < iVar5) && (iVar6 = p->vCover->nSize, iVar6 < 9)) {
        Vec_IntGrow(pVVar10,iVar6);
        Vec_IntAppend(pVVar10,p->vCover);
        if (iVar5 != 0) {
          pbVar1 = (byte *)((long)&pVVar10->nCap + 2);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
      if (p->vIsops[nLits]->nSize != p->vTtMem[nLits]->nEntries) {
        __assert_fail("Vec_WecSize(p->vIsops[nLits]) == Vec_MemEntryNum(p->vTtMem[nLits])",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                      ,0x3fc,"int If_DsdObjFindOrAdd(If_DsdMan_t *, int, int *, int, word *)");
      }
    }
    if ((p->pTtGia != (Gia_Man_t *)0x0 && -1 < iVar4) && (iVar4 == p->vTtMem[nLits]->nEntries + -1))
    {
      iVar5 = Kit_TruthToGia(p->pTtGia,(uint *)pTruth,nLits,p->vCover,(Vec_Int_t *)0x0,1);
      if (iVar5 < 0) {
LAB_00330f3f:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      p_00 = p->pTtGia;
      iVar6 = Abc_Lit2Var(iVar5);
      if (p_00->nObjs <= iVar6) goto LAB_00330f3f;
      iVar6 = Abc_Lit2Var(iVar5);
      pGVar11 = Gia_ManObj(p_00,iVar6);
      if ((~*(uint *)pGVar11 & 0x1fffffff) != 0 && (int)*(uint *)pGVar11 < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar8 = p_00->nObjs;
      if (uVar8 == p_00->nObjsAlloc) {
        uVar2 = uVar8 * 2;
        if (0x1fffffff < (int)(uVar8 * 2)) {
          uVar2 = 0x20000000;
        }
        if (uVar8 == 0x20000000) {
          puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
          exit(1);
        }
        if ((int)uVar2 <= (int)uVar8) {
          __assert_fail("p->nObjs < nObjNew",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x25f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
        }
        if (p_00->fVerbose != 0) {
          printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar8,(ulong)uVar2);
          uVar8 = p_00->nObjsAlloc;
        }
        if ((int)uVar8 < 1) {
          __assert_fail("p->nObjsAlloc > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x262,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
        }
        lVar13 = (long)(int)uVar2;
        if (p_00->pObjs == (Gia_Obj_t *)0x0) {
          pGVar11 = (Gia_Obj_t *)malloc(lVar13 * 0xc);
        }
        else {
          pGVar11 = (Gia_Obj_t *)realloc(p_00->pObjs,lVar13 * 0xc);
          uVar8 = p_00->nObjsAlloc;
        }
        p_00->pObjs = pGVar11;
        memset(pGVar11 + (int)uVar8,0,(long)(int)(uVar2 - uVar8) * 0xc);
        if (p_00->pMuxes != (uint *)0x0) {
          puVar12 = (uint *)realloc(p_00->pMuxes,lVar13 * 4);
          p_00->pMuxes = puVar12;
          memset(puVar12 + p_00->nObjsAlloc,0,(lVar13 - p_00->nObjsAlloc) * 4);
        }
        p_00->nObjsAlloc = uVar2;
        uVar8 = p_00->nObjs;
      }
      p_00->nObjs = uVar8 + 1;
      pGVar11 = Gia_ManObj(p_00,uVar8);
      pGVar11->field_0x3 = pGVar11->field_0x3 | 0x80;
      iVar6 = Gia_ObjId(p_00,pGVar11);
      iVar7 = Abc_Lit2Var(iVar5);
      *(ulong *)pGVar11 =
           *(ulong *)pGVar11 & 0xffffffffe0000000 | (ulong)(iVar6 - iVar7 & 0x1fffffff);
      iVar5 = Abc_LitIsCompl(iVar5);
      uVar3 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar3 & 0xffffffffdfffffff | (ulong)(uint)(iVar5 << 0x1d);
      *(ulong *)pGVar11 =
           uVar3 & 0xe0000000dfffffff | (ulong)(uint)(iVar5 << 0x1d) |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pVVar10 = p_00->vCos;
      iVar5 = Gia_ObjId(p_00,pGVar11);
      Vec_IntPush(pVVar10,iVar5);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11)
        ;
      }
      Gia_ObjId(p_00,pGVar11);
    }
    *puVar9 = (p->vObjs).nSize;
    uVar8 = If_DsdObjCreate(p,Type,pLits,nLits,iVar4);
    iVar5 = (p->vObjs).nSize;
    if (p->nBins < iVar5) {
      iVar4 = p->nUniqueMisses;
      iVar6 = Abc_PrimeCudd(p->nBins * 2);
      p->nBins = iVar6;
      __size = (long)iVar6 << 2;
      if (p->pBins == (uint *)0x0) {
        puVar9 = (uint *)malloc(__size);
      }
      else {
        puVar9 = (uint *)realloc(p->pBins,__size);
        __size = (long)p->nBins << 2;
        iVar5 = (p->vObjs).nSize;
      }
      p->pBins = puVar9;
      memset(puVar9,0,__size);
      Vec_IntFill(&p->vNexts,iVar5,0);
      for (iVar5 = 2; iVar6 = (p->vObjs).nSize, iVar5 < iVar6; iVar5 = iVar5 + 1) {
        pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,iVar5);
        uVar2 = *(uint *)&pObj->field_0x4;
        iVar6 = If_DsdObjTruthId(p,pObj);
        puVar9 = If_DsdObjHashLookup(p,uVar2 & 7,(int *)(pObj + 1),uVar2 >> 0x1b,iVar6);
        if (*puVar9 != 0) {
          __assert_fail("*pSpot == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                        ,0x3b7,"void If_DsdObjHashResize(If_DsdMan_t *)");
        }
        *puVar9 = pObj->Id;
      }
      if (p->nUniqueMisses - iVar4 != iVar6 + -2) {
        __assert_fail("p->nUniqueMisses - Prev == Vec_PtrSize(&p->vObjs) - 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                      ,0x3ba,"void If_DsdObjHashResize(If_DsdMan_t *)");
      }
      p->nUniqueMisses = iVar4;
    }
  }
  return uVar8;
}

Assistant:

int If_DsdObjFindOrAdd( If_DsdMan_t * p, int Type, int * pLits, int nLits, word * pTruth )
{
    int PrevSize       = (Type == IF_DSD_PRIME) ? Vec_MemEntryNum( p->vTtMem[nLits] ) : -1;   
    int objId, truthId = (Type == IF_DSD_PRIME) ? Vec_MemHashInsert(p->vTtMem[nLits], pTruth) : -1;
    unsigned * pSpot = If_DsdObjHashLookup( p, Type, pLits, nLits, truthId );
//abctime clk;
    if ( *pSpot )
        return (int)*pSpot;
//clk = Abc_Clock();
    if ( p->LutSize && truthId >= 0 && truthId == Vec_PtrSize(p->vTtDecs[nLits]) )
    {
        Vec_Int_t * vSets = Dau_DecFindSets_int( pTruth, nLits, p->pSched );
        assert( truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1 );
        Vec_PtrPush( p->vTtDecs[nLits], vSets );
//        Dau_DecPrintSets( vSets, nLits );
    }
    if ( p->vIsops[nLits] && truthId >= 0 && PrevSize != Vec_MemEntryNum(p->vTtMem[nLits]) )
    {
        Vec_Int_t * vLevel = Vec_WecPushLevel( p->vIsops[nLits] );
        int fCompl = Kit_TruthIsop( (unsigned *)pTruth, nLits, p->vCover, 1 );
        if ( fCompl >= 0 && Vec_IntSize(p->vCover) <= 8 )
        {
            Vec_IntGrow( vLevel, Vec_IntSize(p->vCover) );
            Vec_IntAppend( vLevel, p->vCover );
            if ( fCompl )
                vLevel->nCap ^= (1<<16); // hack to remember complemented attribute
        }
        assert( Vec_WecSize(p->vIsops[nLits]) == Vec_MemEntryNum(p->vTtMem[nLits]) );
    }
    if ( p->pTtGia && truthId >= 0 && truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1 )
    {
//        int nObjOld = Gia_ManAndNum(p->pTtGia);
        int Lit = Kit_TruthToGia( p->pTtGia, (unsigned *)pTruth, nLits, p->vCover, NULL, 1 );
//        printf( "%d ", Gia_ManAndNum(p->pTtGia)-nObjOld );
        Gia_ManAppendCo( p->pTtGia, Lit );
    }
//p->timeCheck += Abc_Clock() - clk;
    *pSpot = Vec_PtrSize( &p->vObjs );
    objId = If_DsdObjCreate( p, Type, pLits, nLits, truthId );
    if ( Vec_PtrSize(&p->vObjs) > p->nBins )
        If_DsdObjHashResize( p );
    return objId;
}